

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_qcc_dumpparms(jpc_ms_t *ms,FILE *out)

{
  uint uVar1;
  uint uVar2;
  uint local_24;
  int i;
  jpc_qcc_t *qcc;
  FILE *out_local;
  jpc_ms_t *ms_local;
  
  fprintf((FILE *)out,"compno = %lu; qntsty = %d; numguard = %d; numstepsizes = %d\n",
          (ms->parms).sot.tileno,(ulong)(ms->parms).coc.compparms.csty,
          (ulong)(ms->parms).cod.compparms.cblksty,(ulong)*(uint *)((long)&ms->parms + 0xc));
  for (local_24 = 0; (int)local_24 < *(int *)((long)&ms->parms + 0xc); local_24 = local_24 + 1) {
    uVar1 = JPC_QCX_GETEXPN((uint)*(undefined8 *)((ms->parms).ppm.data + (long)(int)local_24 * 8));
    uVar2 = JPC_QCX_GETMANT((uint)*(undefined8 *)((ms->parms).ppm.data + (long)(int)local_24 * 8));
    fprintf((FILE *)out,"expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",(ulong)local_24,(ulong)uVar1,
            (ulong)local_24,(ulong)uVar2);
  }
  return 0;
}

Assistant:

static int jpc_qcc_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	int i;
	fprintf(out, "compno = %"PRIuFAST16"; qntsty = %d; numguard = %d; "
	  "numstepsizes = %d\n", qcc->compno, qcc->compparms.qntsty, qcc->compparms.numguard,
	  qcc->compparms.numstepsizes);
	for (i = 0; i < qcc->compparms.numstepsizes; ++i) {
		fprintf(out, "expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",
		  i, (unsigned) JPC_QCX_GETEXPN(qcc->compparms.stepsizes[i]),
		  i, (unsigned) JPC_QCX_GETMANT(qcc->compparms.stepsizes[i]));
	}
	return 0;
}